

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_sunmatrix_dense.c
# Opt level: O2

int check_matrix_entry(SUNMatrix A,sunrealtype val,sunrealtype tol)

{
  double dVar1;
  int iVar2;
  long lVar3;
  ulong uVar4;
  int iVar5;
  ulong uVar6;
  ulong uVar7;
  
  lVar3 = SUNDenseMatrix_Data();
  uVar4 = SUNDenseMatrix_LData(A);
  uVar7 = 0;
  if ((long)uVar4 < 1) {
    uVar4 = uVar7;
  }
  for (uVar6 = 0; iVar5 = (int)uVar7, uVar4 != uVar6; uVar6 = uVar6 + 1) {
    iVar2 = SUNRCompareTol(*(undefined8 *)(lVar3 + uVar6 * 8),val,tol);
    uVar7 = (ulong)(uint)(iVar5 + iVar2);
  }
  if (0 < iVar5) {
    puts("Check_matrix_entry failures:");
    for (uVar7 = 0; uVar4 != uVar7; uVar7 = uVar7 + 1) {
      iVar2 = SUNRCompareTol(*(undefined8 *)(lVar3 + uVar7 * 8),val,tol);
      if (iVar2 != 0) {
        dVar1 = *(double *)(lVar3 + uVar7 * 8);
        printf("  Adata[%ld] = %g != %g (err = %g)\n",dVar1,val,ABS(dVar1 - val),uVar7);
      }
    }
  }
  return (int)(0 < iVar5);
}

Assistant:

int check_matrix_entry(SUNMatrix A, sunrealtype val, sunrealtype tol)
{
  int failure = 0;
  sunrealtype* Adata;
  sunindextype Aldata;
  sunindextype i;

  /* get data pointer */
  Adata = SUNDenseMatrix_Data(A);

  /* compare data */
  Aldata = SUNDenseMatrix_LData(A);
  for (i = 0; i < Aldata; i++)
  {
    failure += SUNRCompareTol(Adata[i], val, tol);
  }

  if (failure > ZERO)
  {
    printf("Check_matrix_entry failures:\n");
    for (i = 0; i < Aldata; i++)
    {
      if (SUNRCompareTol(Adata[i], val, tol) != 0)
      {
        printf("  Adata[%ld] = %" GSYM " != %" GSYM " (err = %" GSYM ")\n",
               (long int)i, Adata[i], val, SUNRabs(Adata[i] - val));
      }
    }
  }

  if (failure > ZERO) { return (1); }
  else { return (0); }
}